

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampSamplingTexture.cpp
# Opt level: O0

void __thiscall
glcts::TextureBorderClampSamplingTexture<int,_int>::createTextures
          (TextureBorderClampSamplingTexture<int,_int> *this)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  GLenum GVar4;
  GLuint GVar5;
  GLuint GVar6;
  GLuint GVar7;
  GLenum GVar8;
  GLenum GVar9;
  RenderContext *pRVar10;
  undefined4 extraout_var;
  reference pvVar12;
  TestError *this_00;
  TestConfiguration<int,_int> *pTVar13;
  undefined8 in_stack_fffffffffffffe38;
  undefined4 uVar14;
  allocator<int> local_79;
  undefined1 local_78 [8];
  vector<int,_std::allocator<int>_> inputData_1;
  allocator<int> local_49;
  undefined1 local_48 [8];
  vector<int,_std::allocator<int>_> inputData;
  GLsizei texelsNumber;
  GLsizei components;
  Functions *gl;
  TextureBorderClampSamplingTexture<int,_int> *this_local;
  long lVar11;
  
  uVar14 = (undefined4)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  pRVar10 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar10->_vptr_RenderContext[3])();
  lVar11 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar11 + 0x6f8))(1,&this->m_input_to_id);
  dVar3 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar3,"Error generating texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x107);
  pcVar1 = *(code **)(lVar11 + 0xb8);
  pTVar13 = &this->m_test_configuration;
  GVar4 = TestConfiguration<int,_int>::get_target(pTVar13);
  (*pcVar1)(GVar4,this->m_input_to_id);
  dVar3 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar3,"Error binding texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x10b);
  inputData.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = TestConfiguration<int,_int>::get_n_in_components(pTVar13);
  GVar5 = TestConfiguration<int,_int>::get_width(pTVar13);
  GVar6 = TestConfiguration<int,_int>::get_height(pTVar13);
  GVar7 = TestConfiguration<int,_int>::get_depth(pTVar13);
  inputData.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = GVar5 * GVar6 * GVar7;
  GVar4 = TestConfiguration<int,_int>::get_target(pTVar13);
  if (GVar4 == 0xde1) {
    pcVar1 = *(code **)(lVar11 + 0x1380);
    GVar4 = TestConfiguration<int,_int>::get_target(&this->m_test_configuration);
    GVar8 = TestConfiguration<int,_int>::get_input_internal_format(&this->m_test_configuration);
    GVar5 = TestConfiguration<int,_int>::get_width(&this->m_test_configuration);
    GVar6 = TestConfiguration<int,_int>::get_height(&this->m_test_configuration);
    (*pcVar1)(GVar4,1,GVar8,GVar5,GVar6);
    dVar3 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar3,"Error allocating storage for texture object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                    ,0x11c);
    GVar4 = TestConfiguration<int,_int>::get_input_internal_format(&this->m_test_configuration);
    if (GVar4 == 0x9278) {
      pcVar1 = *(code **)(lVar11 + 0x2a8);
      GVar4 = TestConfiguration<int,_int>::get_target(&this->m_test_configuration);
      GVar5 = TestConfiguration<int,_int>::get_width(&this->m_test_configuration);
      GVar6 = TestConfiguration<int,_int>::get_height(&this->m_test_configuration);
      GVar8 = TestConfiguration<int,_int>::get_input_internal_format(&this->m_test_configuration);
      (*pcVar1)(GVar4,0,0,0,GVar5,GVar6,GVar8,0x1000,"");
      dVar3 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar3,"Error filling texture with compressed data!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                      ,0x129);
    }
    else {
      iVar2 = inputData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_ *
              (int)inputData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
      std::allocator<int>::allocator(&local_49);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_48,(long)iVar2,&local_49);
      std::allocator<int>::~allocator(&local_49);
      setInitData(this,(vector<int,_std::allocator<int>_> *)local_48);
      pcVar1 = *(code **)(lVar11 + 0x13b8);
      pTVar13 = &this->m_test_configuration;
      GVar4 = TestConfiguration<int,_int>::get_target(pTVar13);
      GVar5 = TestConfiguration<int,_int>::get_width(pTVar13);
      GVar6 = TestConfiguration<int,_int>::get_height(pTVar13);
      GVar8 = TestConfiguration<int,_int>::get_input_format(pTVar13);
      GVar9 = TestConfiguration<int,_int>::get_input_type(pTVar13);
      pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)local_48,0);
      (*pcVar1)(GVar4,0,0,0,GVar5,GVar6,GVar8,GVar9,pvVar12);
      dVar3 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar3,"Error filling texture with data!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                      ,0x139);
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_48)
      ;
    }
  }
  else {
    if ((GVar4 != 0x806f) && (GVar4 != 0x8c1a)) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,
                 "Test parameters can contain only following targets: GL_TEXTURE_2D, GL_TEXTURE_2D_ARRAY, GL_TEXTURE_3D!"
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                 ,0x16d);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    pcVar1 = *(code **)(lVar11 + 0x1398);
    GVar4 = TestConfiguration<int,_int>::get_target(&this->m_test_configuration);
    GVar8 = TestConfiguration<int,_int>::get_input_internal_format(&this->m_test_configuration);
    GVar5 = TestConfiguration<int,_int>::get_width(&this->m_test_configuration);
    GVar6 = TestConfiguration<int,_int>::get_height(&this->m_test_configuration);
    GVar7 = TestConfiguration<int,_int>::get_depth(&this->m_test_configuration);
    (*pcVar1)(GVar4,1,GVar8,GVar5,GVar6,GVar7);
    dVar3 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar3,"Error allocating storage for texture object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                    ,0x146);
    GVar4 = TestConfiguration<int,_int>::get_input_internal_format(&this->m_test_configuration);
    if (GVar4 == 0x9278) {
      pcVar1 = *(code **)(lVar11 + 0x2b0);
      GVar4 = TestConfiguration<int,_int>::get_target(&this->m_test_configuration);
      GVar5 = TestConfiguration<int,_int>::get_width(&this->m_test_configuration);
      GVar6 = TestConfiguration<int,_int>::get_height(&this->m_test_configuration);
      GVar7 = TestConfiguration<int,_int>::get_depth(&this->m_test_configuration);
      GVar8 = TestConfiguration<int,_int>::get_input_internal_format(&this->m_test_configuration);
      (*pcVar1)(GVar4,0,0,0,0,GVar5,GVar6,GVar7,CONCAT44(uVar14,GVar8),0x6000,"");
      dVar3 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar3,"Error filling texture with compressed data!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                      ,0x155);
    }
    else {
      iVar2 = inputData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_ *
              (int)inputData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
      std::allocator<int>::allocator(&local_79);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_78,(long)iVar2,&local_79);
      std::allocator<int>::~allocator(&local_79);
      setInitData(this,(vector<int,_std::allocator<int>_> *)local_78);
      pcVar1 = *(code **)(lVar11 + 0x13c0);
      pTVar13 = &this->m_test_configuration;
      GVar4 = TestConfiguration<int,_int>::get_target(pTVar13);
      GVar5 = TestConfiguration<int,_int>::get_width(pTVar13);
      GVar6 = TestConfiguration<int,_int>::get_height(pTVar13);
      GVar7 = TestConfiguration<int,_int>::get_depth(pTVar13);
      GVar8 = TestConfiguration<int,_int>::get_input_format(pTVar13);
      GVar9 = TestConfiguration<int,_int>::get_input_type(pTVar13);
      pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)local_78,0);
      (*pcVar1)(GVar4,0,0,0,0,GVar5,GVar6,GVar7,CONCAT44(uVar14,GVar8),GVar9,pvVar12);
      dVar3 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar3,"Error filling texture with data!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                      ,0x167);
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_78)
      ;
    }
  }
  (**(code **)(lVar11 + 0x6f8))(1,&this->m_output_to_id);
  dVar3 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar3,"Error generating texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x173);
  (**(code **)(lVar11 + 0xb8))(0xde1,this->m_output_to_id);
  dVar3 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar3,"Error binding texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x177);
  pcVar1 = *(code **)(lVar11 + 0x1380);
  GVar4 = TestConfiguration<int,_int>::get_output_internal_format(&this->m_test_configuration);
  GVar5 = TestConfiguration<int,_int>::get_width(&this->m_test_configuration);
  GVar6 = TestConfiguration<int,_int>::get_height(&this->m_test_configuration);
  (*pcVar1)(0xde1,1,GVar4,GVar5,GVar6);
  dVar3 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar3,"Error allocating storage for texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x17c);
  return;
}

Assistant:

void TextureBorderClampSamplingTexture<InputType, OutputType>::createTextures(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Generate input texture */
	gl.genTextures(1, &m_input_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating texture object!");

	/* Bind input texture */
	gl.bindTexture(m_test_configuration.get_target(), m_input_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object!");

	glw::GLsizei components = m_test_configuration.get_n_in_components();
	glw::GLsizei texelsNumber =
		m_test_configuration.get_width() * m_test_configuration.get_height() * m_test_configuration.get_depth();

	/* Allocate storage for input texture and fill it with data */
	{
		switch (m_test_configuration.get_target())
		{
		case GL_TEXTURE_2D:
		{
			gl.texStorage2D(m_test_configuration.get_target(),				  /* target */
							1,												  /* levels */
							m_test_configuration.get_input_internal_format(), /* internalformat */
							m_test_configuration.get_width(),				  /* width */
							m_test_configuration.get_height());				  /* height */
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error allocating storage for texture object!");

			if (m_test_configuration.get_input_internal_format() == GL_COMPRESSED_RGBA8_ETC2_EAC)
			{
				gl.compressedTexSubImage2D(m_test_configuration.get_target(),				 /* target */
										   0,												 /* level */
										   0,												 /* xoffset */
										   0,												 /* yoffset */
										   m_test_configuration.get_width(),				 /* width */
										   m_test_configuration.get_height(),				 /* height */
										   m_test_configuration.get_input_internal_format(), /* internalformat */
										   sizeof(compressed_image_data_2D),				 /* image size */
										   compressed_image_data_2D);						 /* data */
				GLU_EXPECT_NO_ERROR(gl.getError(), "Error filling texture with compressed data!");
			}
			else
			{
				std::vector<InputType> inputData(components * texelsNumber);
				setInitData(inputData);

				gl.texSubImage2D(m_test_configuration.get_target(),		  /* target */
								 0,										  /* level */
								 0,										  /* xoffset */
								 0,										  /* yoffset */
								 m_test_configuration.get_width(),		  /* width */
								 m_test_configuration.get_height(),		  /* height */
								 m_test_configuration.get_input_format(), /* format */
								 m_test_configuration.get_input_type(),   /* type */
								 &inputData[0]);						  /* data */
				GLU_EXPECT_NO_ERROR(gl.getError(), "Error filling texture with data!");
			}
			break;
		}
		case GL_TEXTURE_2D_ARRAY:
		case GL_TEXTURE_3D:
		{
			gl.texStorage3D(m_test_configuration.get_target(),				  /* target */
							1,												  /* levels */
							m_test_configuration.get_input_internal_format(), /* internalformat*/
							m_test_configuration.get_width(),				  /* width */
							m_test_configuration.get_height(),				  /* height */
							m_test_configuration.get_depth());				  /* depth */
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error allocating storage for texture object!");

			if (m_test_configuration.get_input_internal_format() == GL_COMPRESSED_RGBA8_ETC2_EAC)
			{
				gl.compressedTexSubImage3D(m_test_configuration.get_target(),				 /* target */
										   0,												 /* level */
										   0,												 /* xoffset */
										   0,												 /* yoffset */
										   0,												 /* zoffset */
										   m_test_configuration.get_width(),				 /* width */
										   m_test_configuration.get_height(),				 /* height */
										   m_test_configuration.get_depth(),				 /* depth */
										   m_test_configuration.get_input_internal_format(), /* internalformat */
										   sizeof(compressed_image_data_2D_array),			 /* image size */
										   compressed_image_data_2D_array);					 /* data */
				GLU_EXPECT_NO_ERROR(gl.getError(), "Error filling texture with compressed data!");
			}
			else
			{
				std::vector<InputType> inputData(components * texelsNumber);
				setInitData(inputData);

				gl.texSubImage3D(m_test_configuration.get_target(),		  /* target */
								 0,										  /* level */
								 0,										  /* xoffset */
								 0,										  /* yoffset */
								 0,										  /* zoffset */
								 m_test_configuration.get_width(),		  /* width */
								 m_test_configuration.get_height(),		  /* height */
								 m_test_configuration.get_depth(),		  /* depth */
								 m_test_configuration.get_input_format(), /* format */
								 m_test_configuration.get_input_type(),   /* type */
								 &inputData[0]);						  /* data */
				GLU_EXPECT_NO_ERROR(gl.getError(), "Error filling texture with data!");
			}
			break;
		}
		default:
			TCU_FAIL("Test parameters can contain only following targets: GL_TEXTURE_2D, GL_TEXTURE_2D_ARRAY, "
					 "GL_TEXTURE_3D!");
		}
	}

	/* Generate output texture */
	gl.genTextures(1, &m_output_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating texture object!");

	/* Bind output texture */
	gl.bindTexture(GL_TEXTURE_2D, m_output_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object!");

	/* Allocate storage for output texture */
	gl.texStorage2D(GL_TEXTURE_2D, 1, m_test_configuration.get_output_internal_format(),
					m_test_configuration.get_width(), m_test_configuration.get_height());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error allocating storage for texture object!");
}